

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRelaxNGDefinePtr_conflict *
xmlRelaxNGGetElements(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def,int eora)

{
  xmlRelaxNGType xVar1;
  xmlRelaxNGDefinePtr pxVar2;
  xmlRelaxNGDefinePtr_conflict *ppxVar3;
  xmlRelaxNGDefinePtr pxVar4;
  xmlRelaxNGDefinePtr_conflict *ppxVar5;
  int iVar6;
  xmlRelaxNGDefinePtr pxVar7;
  int iVar8;
  
  iVar8 = 0;
  if (ctxt->nbErrors == 0) {
    ppxVar5 = (xmlRelaxNGDefinePtr_conflict *)0x0;
    iVar6 = 0;
    pxVar2 = def;
LAB_00173031:
    pxVar7 = pxVar2;
    if (pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) {
      xVar1 = pxVar7->type;
      if (eora == 2) {
        if ((8 < (uint)xVar1) ||
           ((0x1b8U >> (xVar1 & (XML_RELAXNG_ONEORMORE|XML_RELAXNG_ZEROORMORE)) & 1) == 0))
        goto LAB_00173066;
LAB_00173092:
        if (ppxVar5 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
          ppxVar3 = (xmlRelaxNGDefinePtr_conflict *)(*xmlMalloc)(0x58);
          if (ppxVar3 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
            xmlRngPErrMemory(ctxt,"getting element list\n");
            goto LAB_00172ffc;
          }
          iVar6 = 10;
        }
        else {
          ppxVar3 = ppxVar5;
          if (iVar6 <= iVar8) {
            ppxVar3 = (xmlRelaxNGDefinePtr_conflict *)
                      (*xmlRealloc)(ppxVar5,(long)(iVar6 * 2 + 1) << 3);
            if (ppxVar3 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
              xmlRngPErrMemory(ctxt,"getting element list\n");
              (*xmlFree)(ppxVar5);
              goto LAB_00172ffc;
            }
            iVar6 = iVar6 * 2;
          }
        }
        ppxVar3[iVar8] = pxVar7;
        ppxVar3[(long)iVar8 + 1] = (xmlRelaxNGDefinePtr_conflict)0x0;
        ppxVar5 = ppxVar3;
        iVar8 = iVar8 + 1;
LAB_00173118:
        do {
          if (pxVar7 == def) {
            return ppxVar5;
          }
          pxVar2 = pxVar7->next;
          if (pxVar7->next != (xmlRelaxNGDefinePtr)0x0) goto LAB_00173031;
          pxVar7 = pxVar7->parent;
        } while (pxVar7 != (xmlRelaxNGDefinePtr)0x0);
        pxVar2 = (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      else {
        if (eora == 1) {
          if (xVar1 != XML_RELAXNG_ATTRIBUTE) goto LAB_00173066;
          goto LAB_00173092;
        }
        if ((eora == 0) && ((uint)(xVar1 + ~XML_RELAXNG_EXCEPT) < 2)) goto LAB_00173092;
LAB_00173066:
        if ((9 < (uint)(xVar1 + ~XML_RELAXNG_ATTRIBUTE)) ||
           (pxVar2 = pxVar7->content, pxVar4 = pxVar2, pxVar2 == (xmlRelaxNGDefinePtr)0x0))
        goto LAB_00173118;
        for (; pxVar4 != (xmlRelaxNGDefinePtr)0x0; pxVar4 = pxVar4->next) {
          pxVar4->parent = pxVar7;
        }
      }
      goto LAB_00173031;
    }
  }
  else {
LAB_00172ffc:
    ppxVar5 = (xmlRelaxNGDefinePtr_conflict *)0x0;
  }
  return ppxVar5;
}

Assistant:

static xmlRelaxNGDefinePtr *
xmlRelaxNGGetElements(xmlRelaxNGParserCtxtPtr ctxt,
                      xmlRelaxNGDefinePtr def, int eora)
{
    xmlRelaxNGDefinePtr *ret = NULL, parent, cur, tmp;
    int len = 0;
    int max = 0;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return (NULL);

    parent = NULL;
    cur = def;
    while (cur != NULL) {
        if (((eora == 0) && ((cur->type == XML_RELAXNG_ELEMENT) ||
                             (cur->type == XML_RELAXNG_TEXT))) ||
            ((eora == 1) && (cur->type == XML_RELAXNG_ATTRIBUTE)) ||
            ((eora == 2) && ((cur->type == XML_RELAXNG_DATATYPE) ||
	                     (cur->type == XML_RELAXNG_ELEMENT) ||
			     (cur->type == XML_RELAXNG_LIST) ||
                             (cur->type == XML_RELAXNG_TEXT) ||
			     (cur->type == XML_RELAXNG_VALUE)))) {
            if (ret == NULL) {
                max = 10;
                ret = (xmlRelaxNGDefinePtr *)
                    xmlMalloc((max + 1) * sizeof(xmlRelaxNGDefinePtr));
                if (ret == NULL) {
                    xmlRngPErrMemory(ctxt, "getting element list\n");
                    return (NULL);
                }
            } else if (max <= len) {
	        xmlRelaxNGDefinePtr *temp;

                max *= 2;
                temp = xmlRealloc(ret,
                               (max + 1) * sizeof(xmlRelaxNGDefinePtr));
                if (temp == NULL) {
                    xmlRngPErrMemory(ctxt, "getting element list\n");
		    xmlFree(ret);
                    return (NULL);
                }
		ret = temp;
            }
            ret[len++] = cur;
            ret[len] = NULL;
        } else if ((cur->type == XML_RELAXNG_CHOICE) ||
                   (cur->type == XML_RELAXNG_INTERLEAVE) ||
                   (cur->type == XML_RELAXNG_GROUP) ||
                   (cur->type == XML_RELAXNG_ONEORMORE) ||
                   (cur->type == XML_RELAXNG_ZEROORMORE) ||
                   (cur->type == XML_RELAXNG_OPTIONAL) ||
                   (cur->type == XML_RELAXNG_PARENTREF) ||
                   (cur->type == XML_RELAXNG_REF) ||
                   (cur->type == XML_RELAXNG_DEF) ||
		   (cur->type == XML_RELAXNG_EXTERNALREF)) {
            /*
             * Don't go within elements or attributes or string values.
             * Just gather the element top list
             */
            if (cur->content != NULL) {
                parent = cur;
                cur = cur->content;
                tmp = cur;
                while (tmp != NULL) {
                    tmp->parent = parent;
                    tmp = tmp->next;
                }
                continue;
            }
        }
        if (cur == def)
            break;
        if (cur->next != NULL) {
            cur = cur->next;
            continue;
        }
        do {
            cur = cur->parent;
            if (cur == NULL)
                break;
            if (cur == def)
                return (ret);
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
        } while (cur != NULL);
    }
    return (ret);
}